

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O1

void tcu::fillWithRepeatableGradient(PixelBufferAccess *access,Vec4 *colorA,Vec4 *colorB)

{
  int i;
  int iVar1;
  long lVar2;
  int x;
  int y;
  float fVar3;
  float fVar4;
  float fVar5;
  Vector<float,_4> res_2;
  Vector<float,_4> res;
  Vector<float,_4> res_1;
  Vec4 local_68;
  float local_58 [4];
  float local_48 [4];
  
  if (0 < (access->super_ConstPixelBufferAccess).m_size.m_data[1]) {
    y = 0;
    do {
      iVar1 = (access->super_ConstPixelBufferAccess).m_size.m_data[0];
      if (0 < iVar1) {
        x = 0;
        do {
          fVar3 = ((float)x + 0.5) / (float)iVar1;
          fVar5 = ((float)y + 0.5) / (float)(access->super_ConstPixelBufferAccess).m_size.m_data[1];
          fVar4 = (float)((uint)(2.0 - (fVar3 + fVar3)) & -(uint)(0.5 < fVar3) |
                         ~-(uint)(0.5 < fVar3) & (uint)(fVar3 + fVar3));
          fVar3 = (float)((uint)(2.0 - (fVar5 + fVar5)) & -(uint)(0.5 < fVar5) |
                         ~-(uint)(0.5 < fVar5) & (uint)(fVar5 + fVar5));
          fVar3 = fVar4 * fVar4 + fVar3 * fVar3;
          if (fVar3 < 0.0) {
            fVar3 = sqrtf(fVar3);
          }
          else {
            fVar3 = SQRT(fVar3);
          }
          local_68.m_data._0_12_ = ZEXT812(0);
          local_68.m_data[3] = 0.0;
          fVar4 = 1.0;
          if (fVar3 <= 1.0) {
            fVar4 = fVar3;
          }
          local_58[0] = local_68.m_data[0];
          local_58[1] = local_68.m_data[1];
          local_58[2] = local_68.m_data[2];
          local_58[3] = 0.0;
          lVar2 = 0;
          do {
            local_58[lVar2] = colorB->m_data[lVar2] - colorA->m_data[lVar2];
            lVar2 = lVar2 + 1;
          } while (lVar2 != 4);
          local_48[0] = local_68.m_data[0];
          local_48[1] = local_68.m_data[1];
          local_48[2] = local_68.m_data[2];
          local_48[3] = 0.0;
          lVar2 = 0;
          do {
            local_48[lVar2] = local_58[lVar2] * (float)(-(uint)(0.0 < fVar3) & (uint)fVar4);
            lVar2 = lVar2 + 1;
          } while (lVar2 != 4);
          lVar2 = 0;
          do {
            local_68.m_data[lVar2] = colorA->m_data[lVar2] + local_48[lVar2];
            lVar2 = lVar2 + 1;
          } while (lVar2 != 4);
          PixelBufferAccess::setPixel(access,&local_68,x,y,0);
          x = x + 1;
          iVar1 = (access->super_ConstPixelBufferAccess).m_size.m_data[0];
        } while (x < iVar1);
      }
      y = y + 1;
    } while (y < (access->super_ConstPixelBufferAccess).m_size.m_data[1]);
  }
  return;
}

Assistant:

void fillWithRepeatableGradient (const PixelBufferAccess& access, const Vec4& colorA, const Vec4& colorB)
{
	for (int y = 0; y < access.getHeight(); y++)
	{
		for (int x = 0; x < access.getWidth(); x++)
		{
			float s = ((float)x + 0.5f) / (float)access.getWidth();
			float t = ((float)y + 0.5f) / (float)access.getHeight();

			float a = s > 0.5f ? (2.0f - 2.0f*s) : 2.0f*s;
			float b = t > 0.5f ? (2.0f - 2.0f*t) : 2.0f*t;

			float p = deFloatClamp(deFloatSqrt(a*a + b*b), 0.0f, 1.0f);
			access.setPixel(linearInterpolate(p, colorA, colorB), x, y);
		}
	}
}